

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O2

string * __thiscall
FIX::error_strerror_abi_cxx11_(string *__return_storage_ptr__,FIX *this,int *error_number)

{
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::to_string(&local_38,*(int *)this);
  std::operator+(&bStack_98,"(errno[",&local_38);
  std::operator+(&local_78,&bStack_98,"]:");
  __rhs = strerror(*(int *)this);
  std::operator+(&local_58,&local_78,__rhs);
  std::operator+(__return_storage_ptr__,&local_58,")");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string error_strerror(decltype(errno) error_number) {
  return "(errno[" + std::to_string(error_number) + "]:" + std::strerror(error_number) + ")";
}